

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

void bufcp_put(bufc_pool *pool,buf_chunk *chunk)

{
  buf_chunk *chunk_local;
  bufc_pool *pool_local;
  
  if (pool->spare_count < pool->spare_max) {
    chunk_reset(chunk);
    chunk->next = pool->spare;
    pool->spare = chunk;
    pool->spare_count = pool->spare_count + 1;
  }
  else {
    (*Curl_cfree)(chunk);
  }
  return;
}

Assistant:

static void bufcp_put(struct bufc_pool *pool,
                      struct buf_chunk *chunk)
{
  if(pool->spare_count >= pool->spare_max) {
    free(chunk);
  }
  else {
    chunk_reset(chunk);
    chunk->next = pool->spare;
    pool->spare = chunk;
    ++pool->spare_count;
  }
}